

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O1

void __thiscall HACD::RaycastMesh::ComputeBB(RaycastMesh *this)

{
  double *pdVar1;
  double *pdVar2;
  Vec3<double> *pVVar3;
  double *pdVar4;
  double dVar5;
  size_t sVar6;
  Vec3<double> *pVVar7;
  long lVar8;
  double *pdVar9;
  BBox *pBVar10;
  double *pdVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  sVar6 = this->m_nVertices;
  if (sVar6 != 0) {
    pVVar7 = this->m_vertices;
    (this->m_bBox).m_min.m_data[0] = pVVar7->m_data[0];
    (this->m_bBox).m_min.m_data[1] = pVVar7->m_data[1];
    (this->m_bBox).m_min.m_data[2] = pVVar7->m_data[2];
    (this->m_bBox).m_max.m_data[0] = pVVar7->m_data[0];
    (this->m_bBox).m_max.m_data[1] = pVVar7->m_data[1];
    dVar12 = pVVar7->m_data[2];
    (this->m_bBox).m_max.m_data[2] = dVar12;
    if (sVar6 != 1) {
      pdVar1 = (this->m_bBox).m_min.m_data + 1;
      pdVar2 = (this->m_bBox).m_min.m_data + 2;
      pVVar3 = &(this->m_bBox).m_max;
      pdVar4 = (this->m_bBox).m_max.m_data + 1;
      dVar14 = *pdVar2;
      dVar17 = *pdVar4;
      dVar15 = *pdVar1;
      dVar18 = pVVar3->m_data[0];
      dVar16 = (this->m_bBox).m_min.m_data[0];
      lVar8 = sVar6 - 1;
      pdVar9 = pVVar7[1].m_data + 2;
      do {
        dVar19 = ((Vec3<double> *)(pdVar9 + -2))->m_data[0];
        dVar13 = pdVar9[-1];
        dVar5 = *pdVar9;
        pBVar10 = &this->m_bBox;
        dVar20 = dVar19;
        dVar21 = dVar18;
        if ((dVar19 < dVar16) ||
           (pBVar10 = (BBox *)pVVar3, dVar20 = dVar16, dVar21 = dVar19, dVar18 < dVar19)) {
          (pBVar10->m_min).m_data[0] = dVar19;
          dVar16 = dVar20;
          dVar18 = dVar21;
        }
        pdVar11 = pdVar1;
        dVar19 = dVar13;
        dVar20 = dVar17;
        if ((dVar13 < dVar15) ||
           (pdVar11 = pdVar4, dVar19 = dVar15, dVar20 = dVar13, dVar17 < dVar13)) {
          *pdVar11 = dVar13;
          dVar15 = dVar19;
          dVar17 = dVar20;
        }
        pdVar11 = pdVar2;
        dVar19 = dVar12;
        dVar13 = dVar5;
        if ((dVar5 < dVar14) ||
           (pdVar11 = (this->m_bBox).m_max.m_data + 2, dVar19 = dVar5, dVar13 = dVar14,
           dVar12 < dVar5)) {
          *pdVar11 = dVar5;
          dVar14 = dVar13;
          dVar12 = dVar19;
        }
        pdVar9 = pdVar9 + 3;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
  }
  return;
}

Assistant:

void RaycastMesh::ComputeBB()
	{
		if (m_nVertices == 0)
		{
			return;
		}
		m_bBox.m_min = m_vertices[0];
		m_bBox.m_max = m_vertices[0];
		Float x, y, z;
        for (size_t v = 1; v < m_nVertices ; v++) 
        {
            x = m_vertices[v].X();
            y = m_vertices[v].Y();
            z = m_vertices[v].Z();
            if ( x < m_bBox.m_min.X()) m_bBox.m_min.X() = x;
			else if ( x > m_bBox.m_max.X()) m_bBox.m_max.X() = x;
            if ( y < m_bBox.m_min.Y()) m_bBox.m_min.Y() = y;
			else if ( y > m_bBox.m_max.Y()) m_bBox.m_max.Y() = y;
            if ( z < m_bBox.m_min.Z()) m_bBox.m_min.Z() = z;
			else if ( z > m_bBox.m_max.Z()) m_bBox.m_max.Z() = z;
        }
	}